

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_parse_der_core(mbedtls_x509_crt *crt,uchar *buf,size_t buflen)

{
  int iVar1;
  uchar *puVar2;
  uchar *end_00;
  undefined1 local_98 [8];
  mbedtls_x509_buf sig_oid2;
  mbedtls_x509_buf sig_params2;
  mbedtls_x509_buf sig_params1;
  uchar *crt_end;
  uchar *end;
  uchar *p;
  size_t len;
  uchar *puStack_28;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_x509_crt *crt_local;
  
  puStack_28 = (uchar *)buflen;
  buflen_local = (size_t)buf;
  buf_local = (uchar *)crt;
  memset(&sig_params2.p,0,0x18);
  memset(&sig_oid2.p,0,0x18);
  memset(local_98,0,0x18);
  if ((buf_local == (uchar *)0x0) || (buflen_local == 0)) {
    crt_local._4_4_ = -0x2800;
  }
  else {
    p = puStack_28;
    end = (uchar *)calloc(1,(size_t)puStack_28);
    if (end == (uchar *)0x0) {
      crt_local._4_4_ = -0x2880;
    }
    else {
      memcpy(end,(void *)buflen_local,(size_t)puStack_28);
      *(uchar **)(buf_local + 0x10) = end;
      *(uchar **)(buf_local + 8) = p;
      puVar2 = end + (long)p;
      len._4_4_ = mbedtls_asn1_get_tag(&end,puVar2,(size_t *)&p,0x30);
      if (len._4_4_ == 0) {
        if (puVar2 + -(long)end < p) {
          mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
          crt_local._4_4_ = -0x21e6;
        }
        else {
          end_00 = end + (long)p;
          *(uchar **)(buf_local + 0x28) = end;
          len._4_4_ = mbedtls_asn1_get_tag(&end,puVar2,(size_t *)&p,0x30);
          if (len._4_4_ == 0) {
            puVar2 = end + (long)p;
            *(long *)(buf_local + 0x20) = (long)puVar2 - *(long *)(buf_local + 0x28);
            len._4_4_ = x509_get_version(&end,puVar2,(int *)(buf_local + 0x30));
            if (((len._4_4_ == 0) &&
                (len._4_4_ = mbedtls_x509_get_serial
                                       (&end,puVar2,(mbedtls_x509_buf *)(buf_local + 0x38)),
                len._4_4_ == 0)) &&
               (len._4_4_ = mbedtls_x509_get_alg
                                      (&end,puVar2,(mbedtls_x509_buf *)(buf_local + 0x50),
                                       (mbedtls_x509_buf *)&sig_params2.p), len._4_4_ == 0)) {
              *(int *)(buf_local + 0x30) = *(int *)(buf_local + 0x30) + 1;
              if (*(int *)(buf_local + 0x30) < 4) {
                len._4_4_ = mbedtls_x509_get_sig_alg
                                      ((mbedtls_x509_buf *)(buf_local + 0x50),
                                       (mbedtls_x509_buf *)&sig_params2.p,
                                       (mbedtls_md_type_t *)(buf_local + 0x210),
                                       (mbedtls_pk_type_t *)(buf_local + 0x214),
                                       (void **)(buf_local + 0x218));
                if (len._4_4_ == 0) {
                  *(uchar **)(buf_local + 0x78) = end;
                  len._4_4_ = mbedtls_asn1_get_tag(&end,puVar2,(size_t *)&p,0x30);
                  if (len._4_4_ == 0) {
                    len._4_4_ = mbedtls_x509_get_name
                                          (&end,end + (long)p,
                                           (mbedtls_x509_name *)(buf_local + 0x98));
                    if (len._4_4_ == 0) {
                      *(long *)(buf_local + 0x70) = (long)end - *(long *)(buf_local + 0x78);
                      len._4_4_ = x509_get_dates(&end,puVar2,
                                                 (mbedtls_x509_time *)(buf_local + 0x118),
                                                 (mbedtls_x509_time *)(buf_local + 0x130));
                      if (len._4_4_ == 0) {
                        *(uchar **)(buf_local + 0x90) = end;
                        len._4_4_ = mbedtls_asn1_get_tag(&end,puVar2,(size_t *)&p,0x30);
                        if (len._4_4_ == 0) {
                          iVar1 = 0;
                          if ((p == (uchar *)0x0) ||
                             (len._4_4_ = mbedtls_x509_get_name
                                                    (&end,end + (long)p,
                                                     (mbedtls_x509_name *)(buf_local + 0xd8)),
                             iVar1 = len._4_4_, len._4_4_ == 0)) {
                            len._4_4_ = iVar1;
                            *(long *)(buf_local + 0x88) = (long)end - *(long *)(buf_local + 0x90);
                            len._4_4_ = mbedtls_pk_parse_subpubkey
                                                  (&end,puVar2,
                                                   (mbedtls_pk_context *)(buf_local + 0x148));
                            if (len._4_4_ == 0) {
                              if (((*(int *)(buf_local + 0x30) == 2) ||
                                  (*(int *)(buf_local + 0x30) == 3)) &&
                                 (len._4_4_ = x509_get_uid(&end,puVar2,
                                                           (mbedtls_x509_buf *)(buf_local + 0x158),1
                                                          ), len._4_4_ != 0)) {
                                mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                                crt_local._4_4_ = len._4_4_;
                              }
                              else {
                                len._4_4_ = 0;
                                if (((*(int *)(buf_local + 0x30) == 2) ||
                                    (*(int *)(buf_local + 0x30) == 3)) &&
                                   (len._4_4_ = x509_get_uid(&end,puVar2,
                                                             (mbedtls_x509_buf *)(buf_local + 0x170)
                                                             ,2), len._4_4_ != 0)) {
                                  mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                                  crt_local._4_4_ = len._4_4_;
                                }
                                else {
                                  len._4_4_ = 0;
                                  if ((*(int *)(buf_local + 0x30) == 3) &&
                                     (len._4_4_ = x509_get_crt_ext(&end,puVar2,
                                                                   (mbedtls_x509_crt *)buf_local),
                                     len._4_4_ != 0)) {
                                    mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                                    crt_local._4_4_ = len._4_4_;
                                  }
                                  else {
                                    len._4_4_ = 0;
                                    if (end == puVar2) {
                                      len._4_4_ = mbedtls_x509_get_alg
                                                            (&end,end_00,
                                                             (mbedtls_x509_buf *)local_98,
                                                             (mbedtls_x509_buf *)&sig_oid2.p);
                                      if (len._4_4_ == 0) {
                                        if (((*(long *)(buf_local + 0x58) == sig_oid2._0_8_) &&
                                            (iVar1 = memcmp(*(void **)(buf_local + 0x60),
                                                            (void *)sig_oid2.len,
                                                            *(size_t *)(buf_local + 0x58)),
                                            iVar1 == 0)) &&
                                           ((sig_params1._0_8_ == sig_params2._0_8_ &&
                                            ((sig_params1._0_8_ == 0 ||
                                             (iVar1 = memcmp((void *)sig_params1.len,
                                                             (void *)sig_params2.len,
                                                             sig_params1._0_8_), iVar1 == 0)))))) {
                                          len._4_4_ = mbedtls_x509_get_sig
                                                                (&end,end_00,
                                                                 (mbedtls_x509_buf *)
                                                                 (buf_local + 0x1f8));
                                          if (len._4_4_ == 0) {
                                            if (end == end_00) {
                                              crt_local._4_4_ = 0;
                                            }
                                            else {
                                              mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                                              crt_local._4_4_ = -0x21e6;
                                            }
                                          }
                                          else {
                                            mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                                            crt_local._4_4_ = len._4_4_;
                                          }
                                        }
                                        else {
                                          mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                                          crt_local._4_4_ = -0x2680;
                                        }
                                      }
                                      else {
                                        mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                                        crt_local._4_4_ = len._4_4_;
                                      }
                                    }
                                    else {
                                      mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                                      crt_local._4_4_ = -0x21e6;
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                              crt_local._4_4_ = len._4_4_;
                            }
                          }
                          else {
                            mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                            crt_local._4_4_ = len._4_4_;
                          }
                        }
                        else {
                          mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                          crt_local._4_4_ = len._4_4_ + -0x2180;
                        }
                      }
                      else {
                        mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                        crt_local._4_4_ = len._4_4_;
                      }
                    }
                    else {
                      mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                      crt_local._4_4_ = len._4_4_;
                    }
                  }
                  else {
                    mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                    crt_local._4_4_ = len._4_4_ + -0x2180;
                  }
                }
                else {
                  mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                  crt_local._4_4_ = len._4_4_;
                }
              }
              else {
                mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
                crt_local._4_4_ = -0x2580;
              }
            }
            else {
              mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
              crt_local._4_4_ = len._4_4_;
            }
          }
          else {
            mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
            crt_local._4_4_ = len._4_4_ + -0x2180;
          }
        }
      }
      else {
        mbedtls_x509_crt_free((mbedtls_x509_crt *)buf_local);
        crt_local._4_4_ = -0x2180;
      }
    }
  }
  return crt_local._4_4_;
}

Assistant:

static int x509_crt_parse_der_core( mbedtls_x509_crt *crt, const unsigned char *buf,
                                    size_t buflen )
{
    int ret;
    size_t len;
    unsigned char *p, *end, *crt_end;
    mbedtls_x509_buf sig_params1, sig_params2, sig_oid2;

    memset( &sig_params1, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_params2, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_oid2, 0, sizeof( mbedtls_x509_buf ) );

    /*
     * Check for valid input
     */
    if( crt == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    p = mbedtls_calloc( 1, len = buflen );
    if( p == NULL )
        return( MBEDTLS_ERR_X509_ALLOC_FAILED );

    memcpy( p, buf, buflen );

    crt->raw.p = p;
    crt->raw.len = len;
    end = p + len;

    /*
     * Certificate  ::=  SEQUENCE  {
     *      tbsCertificate       TBSCertificate,
     *      signatureAlgorithm   AlgorithmIdentifier,
     *      signatureValue       BIT STRING  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );
    }

    if( len > (size_t) ( end - p ) )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }
    crt_end = p + len;

    /*
     * TBSCertificate  ::=  SEQUENCE  {
     */
    crt->tbs.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    end = p + len;
    crt->tbs.len = end - crt->tbs.p;

    /*
     * Version  ::=  INTEGER  {  v1(0), v2(1), v3(2)  }
     *
     * CertificateSerialNumber  ::=  INTEGER
     *
     * signature            AlgorithmIdentifier
     */
    if( ( ret = x509_get_version(  &p, end, &crt->version  ) ) != 0 ||
        ( ret = mbedtls_x509_get_serial(   &p, end, &crt->serial   ) ) != 0 ||
        ( ret = mbedtls_x509_get_alg(      &p, end, &crt->sig_oid,
                                            &sig_params1 ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( ret );
    }

    crt->version++;

    if( crt->version > 3 )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_UNKNOWN_VERSION );
    }

    if( ( ret = mbedtls_x509_get_sig_alg( &crt->sig_oid, &sig_params1,
                                  &crt->sig_md, &crt->sig_pk,
                                  &crt->sig_opts ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( ret );
    }

    /*
     * issuer               Name
     */
    crt->issuer_raw.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_x509_get_name( &p, p + len, &crt->issuer ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( ret );
    }

    crt->issuer_raw.len = p - crt->issuer_raw.p;

    /*
     * Validity ::= SEQUENCE {
     *      notBefore      Time,
     *      notAfter       Time }
     *
     */
    if( ( ret = x509_get_dates( &p, end, &crt->valid_from,
                                         &crt->valid_to ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( ret );
    }

    /*
     * subject              Name
     */
    crt->subject_raw.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    if( len && ( ret = mbedtls_x509_get_name( &p, p + len, &crt->subject ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( ret );
    }

    crt->subject_raw.len = p - crt->subject_raw.p;

    /*
     * SubjectPublicKeyInfo
     */
    if( ( ret = mbedtls_pk_parse_subpubkey( &p, end, &crt->pk ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( ret );
    }

    /*
     *  issuerUniqueID  [1]  IMPLICIT UniqueIdentifier OPTIONAL,
     *                       -- If present, version shall be v2 or v3
     *  subjectUniqueID [2]  IMPLICIT UniqueIdentifier OPTIONAL,
     *                       -- If present, version shall be v2 or v3
     *  extensions      [3]  EXPLICIT Extensions OPTIONAL
     *                       -- If present, version shall be v3
     */
    if( crt->version == 2 || crt->version == 3 )
    {
        ret = x509_get_uid( &p, end, &crt->issuer_id,  1 );
        if( ret != 0 )
        {
            mbedtls_x509_crt_free( crt );
            return( ret );
        }
    }

    if( crt->version == 2 || crt->version == 3 )
    {
        ret = x509_get_uid( &p, end, &crt->subject_id,  2 );
        if( ret != 0 )
        {
            mbedtls_x509_crt_free( crt );
            return( ret );
        }
    }

#if !defined(MBEDTLS_X509_ALLOW_EXTENSIONS_NON_V3)
    if( crt->version == 3 )
#endif
    {
        ret = x509_get_crt_ext( &p, end, crt );
        if( ret != 0 )
        {
            mbedtls_x509_crt_free( crt );
            return( ret );
        }
    }

    if( p != end )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    end = crt_end;

    /*
     *  }
     *  -- end of TBSCertificate
     *
     *  signatureAlgorithm   AlgorithmIdentifier,
     *  signatureValue       BIT STRING
     */
    if( ( ret = mbedtls_x509_get_alg( &p, end, &sig_oid2, &sig_params2 ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( ret );
    }

    if( crt->sig_oid.len != sig_oid2.len ||
        memcmp( crt->sig_oid.p, sig_oid2.p, crt->sig_oid.len ) != 0 ||
        sig_params1.len != sig_params2.len ||
        ( sig_params1.len != 0 &&
          memcmp( sig_params1.p, sig_params2.p, sig_params1.len ) != 0 ) )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_SIG_MISMATCH );
    }

    if( ( ret = mbedtls_x509_get_sig( &p, end, &crt->sig ) ) != 0 )
    {
        mbedtls_x509_crt_free( crt );
        return( ret );
    }

    if( p != end )
    {
        mbedtls_x509_crt_free( crt );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    return( 0 );
}